

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
sznet::net::TcpServer::newConnection(TcpServer *this,sz_sock sockfd,InetAddress *peerAddr)

{
  LogLevel LVar1;
  element_type *this_00;
  undefined8 uVar2;
  LogStream *this_01;
  self *psVar3;
  TcpConnection *this_02;
  mapped_type *this_03;
  element_type *peVar4;
  SourceFile file;
  code *local_1188;
  undefined8 local_1180;
  type local_1178;
  Functor local_1158;
  TcpServer *local_1138;
  code *local_1130;
  undefined8 local_1128;
  type local_1120;
  CloseCallback local_1108;
  undefined1 local_10e8 [8];
  TcpConnectionPtr conn;
  undefined1 local_10bc [8];
  InetAddress localAddr;
  undefined1 local_1080 [12];
  Logger local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [8];
  string connName;
  uint local_6c;
  char local_68 [4];
  uint32_t connId;
  char buf [64];
  EventLoop *ioLoop;
  InetAddress *peerAddr_local;
  sz_sock sockfd_local;
  TcpServer *this_local;
  
  EventLoop::assertInLoopThread(this->m_loop);
  this_00 = std::
            __shared_ptr_access<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_threadPool);
  buf._56_8_ = EventLoopThreadPool::getNextLoop(this_00);
  local_6c = this->m_nextConnId;
  this->m_nextConnId = local_6c + 1;
  uVar2 = std::__cxx11::string::c_str();
  snprintf(local_68,0x40,"-%s#%d",uVar2,(ulong)local_6c);
  std::operator+(local_90,(char *)&this->m_name);
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1080,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1080._0_8_;
    file.m_size = local_1080._8_4_;
    Logger::Logger(&local_1070,file,0x46);
    this_01 = Logger::stream(&local_1070);
    psVar3 = LogStream::operator<<(this_01,"TcpServer::newConnection [");
    psVar3 = LogStream::operator<<(psVar3,&this->m_name);
    psVar3 = LogStream::operator<<(psVar3,"] - new connection [");
    psVar3 = LogStream::operator<<(psVar3,local_90);
    psVar3 = LogStream::operator<<(psVar3,"] from ");
    InetAddress::toIpPort_abi_cxx11_
              ((InetAddress *)((long)&localAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc));
    LogStream::operator<<
              (psVar3,(string *)(localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
    std::__cxx11::string::~string
              ((string *)(localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
    Logger::~Logger(&local_1070);
  }
  sockets::sz_sock_getlocaladdr
            ((sockaddr_in6 *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,sockfd);
  InetAddress::InetAddress
            ((InetAddress *)local_10bc,
             (sockaddr_in6 *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this_02 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_02,(EventLoop *)buf._56_8_,local_90,local_6c,sockfd,(InetAddress *)local_10bc,
             peerAddr);
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr<sznet::net::TcpConnection,void>
            ((shared_ptr<sznet::net::TcpConnection> *)local_10e8,this_02);
  this_03 = std::
            map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
            ::operator[](&this->m_connections,&local_6c);
  std::shared_ptr<sznet::net::TcpConnection>::operator=
            (this_03,(shared_ptr<sznet::net::TcpConnection> *)local_10e8);
  peVar4 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_10e8);
  TcpConnection::setConnectionCallback(peVar4,&this->m_connectionCallback);
  peVar4 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_10e8);
  TcpConnection::setMessageCallback(peVar4,&this->m_messageCallback);
  peVar4 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_10e8);
  TcpConnection::setWriteCompleteCallback(peVar4,&this->m_writeCompleteCallback);
  peVar4 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_10e8);
  local_1130 = removeConnection;
  local_1128 = 0;
  local_1138 = this;
  std::
  bind<void(sznet::net::TcpServer::*)(std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::TcpServer*,std::_Placeholder<1>const&>
            (&local_1120,(offset_in_TcpServer_to_subr *)&local_1130,&local_1138,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
  function<std::_Bind<void(sznet::net::TcpServer::*(sznet::net::TcpServer*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)&local_1108,
             &local_1120);
  TcpConnection::setCloseCallback(peVar4,&local_1108);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function(&local_1108);
  uVar2 = buf._56_8_;
  local_1188 = TcpConnection::connectEstablished;
  local_1180 = 0;
  std::bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>&>
            (&local_1178,(offset_in_TcpConnection_to_subr *)&local_1188,
             (shared_ptr<sznet::net::TcpConnection> *)local_10e8);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
            ((function<void()> *)&local_1158,&local_1178);
  EventLoop::runInLoop((EventLoop *)uVar2,&local_1158);
  std::function<void_()>::~function(&local_1158);
  std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
  ~_Bind(&local_1178);
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)local_10e8);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void TcpServer::newConnection(sockets::sz_sock sockfd, const InetAddress& peerAddr)
{
	m_loop->assertInLoopThread();
	EventLoop* ioLoop = m_threadPool->getNextLoop();
	char buf[64];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), "-%s#%d", m_ipPort.c_str(), connId);
	string connName = m_name + buf;

	LOG_INFO << "TcpServer::newConnection [" << m_name
		<< "] - new connection [" << connName
		<< "] from " << peerAddr.toIpPort();
	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// ��������
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(ioLoop, connName, connId, sockfd, localAddr, peerAddr));
	m_connections[connId] = conn;
	conn->setConnectionCallback(m_connectionCallback);
	conn->setMessageCallback(m_messageCallback);
	conn->setWriteCompleteCallback(m_writeCompleteCallback);
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&TcpServer::removeConnection, this, std::placeholders::_1));
	ioLoop->runInLoop(std::bind(&TcpConnection::connectEstablished, conn));
}